

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_class_dice(parser *p)

{
  wchar_t wVar1;
  long lVar2;
  long *plVar3;
  _Bool _Var4;
  void *pvVar5;
  long *plVar6;
  dice_t *dice;
  char *string;
  long lVar7;
  parser_error pVar8;
  
  pvVar5 = parser_priv(p);
  pVar8 = PARSE_ERROR_MISSING_RECORD_HEADER;
  if (pvVar5 != (void *)0x0) {
    wVar1 = *(wchar_t *)((long)pvVar5 + 0xf8);
    if (0 < (long)wVar1) {
      lVar2 = *(long *)((long)pvVar5 + 0x100);
      if ((lVar2 == 0) || (class_max_books < wVar1)) {
        __assert_fail("c->magic.books && c->magic.num_books <= class_max_books",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                      ,0xf4e,"enum parser_error parse_class_dice(struct parser *)");
      }
      lVar7 = (long)wVar1 * 0x20;
      wVar1 = *(wchar_t *)(lVar2 + -0x14 + lVar7);
      if (0 < (long)wVar1) {
        lVar2 = *(long *)(lVar2 + lVar7 + -8);
        if ((lVar2 == 0) || (book_max_spells < wVar1)) {
          __assert_fail("book->spells && book->num_spells <= book_max_spells",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                        ,0xf54,"enum parser_error parse_class_dice(struct parser *)");
        }
        plVar3 = *(long **)(lVar2 + -0x28 + (long)wVar1 * 0x38);
        pVar8 = PARSE_ERROR_NONE;
        if (plVar3 != (long *)0x0) {
          do {
            plVar6 = plVar3;
            plVar3 = (long *)*plVar6;
          } while ((long *)*plVar6 != (long *)0x0);
          dice = dice_new();
          if (dice != (dice_t *)0x0) {
            string = parser_getstr(p,"dice");
            _Var4 = dice_parse_string(dice,string);
            if (_Var4) {
              dice_free((dice_t *)plVar6[2]);
              plVar6[2] = (long)dice;
              return PARSE_ERROR_NONE;
            }
            dice_free(dice);
          }
          pVar8 = PARSE_ERROR_INVALID_DICE;
        }
      }
    }
  }
  return pVar8;
}

Assistant:

static enum parser_error parse_class_dice(struct parser *p) {
	struct player_class *c = parser_priv(p);
	struct class_book *book;
	struct class_spell *spell;
	struct effect *effect;
	dice_t *dice;
	const char *string;

	if (!c) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (c->magic.num_books < 1) {
		/*
		 * Either missing a magic directive for the class or didn't
		 * have a book directive after the magic directive.
		 */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(c->magic.books && c->magic.num_books <= class_max_books);
	book = &c->magic.books[c->magic.num_books - 1];
	if (book->num_spells < 1) {
		/* Missing a spell directive after the book directive. */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(book->spells && book->num_spells <= book_max_spells);
	spell = &book->spells[book->num_spells - 1];
	/* If there is no effect, assume that this is human and not parser error. */
	effect = spell->effect;
	if (effect == NULL) {
		return PARSE_ERROR_NONE;
	}
	while (effect->next) effect = effect->next;

	dice = dice_new();
	if (dice == NULL) {
		return PARSE_ERROR_INVALID_DICE;
	}

	string = parser_getstr(p, "dice");
	if (dice_parse_string(dice, string)) {
		dice_free(effect->dice);
		effect->dice = dice;
	} else {
		dice_free(dice);
		return PARSE_ERROR_INVALID_DICE;
	}

	return PARSE_ERROR_NONE;
}